

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall ast_node::set_location(ast_node *this,YYLTYPE *locp)

{
  YYLTYPE *locp_local;
  ast_node *this_local;
  
  (this->location).path = locp->path;
  (this->location).source = locp->source;
  (this->location).first_line = locp->first_line;
  (this->location).first_column = locp->first_column;
  (this->location).last_line = locp->last_line;
  (this->location).last_column = locp->last_column;
  return;
}

Assistant:

void set_location(const struct YYLTYPE &locp)
   {
      this->location.path = locp.path;
      this->location.source = locp.source;
      this->location.first_line = locp.first_line;
      this->location.first_column = locp.first_column;
      this->location.last_line = locp.last_line;
      this->location.last_column = locp.last_column;
   }